

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marketgenerator.cpp
# Opt level: O0

void __thiscall hedg::MarketGenerator::poll_within(MarketGenerator *this,int time1,int time2)

{
  reference pvVar1;
  double dVar2;
  int local_a4;
  duration<long,_std::ratio<1L,_1L>_> local_a0;
  undefined4 local_94;
  string local_90;
  string local_60;
  double local_40;
  double diff;
  string time_now;
  int time2_local;
  int time1_local;
  MarketGenerator *this_local;
  
  time_now.field_2._8_4_ = time2;
  time_now.field_2._12_4_ = time1;
  wait_for_gen(this);
  Timing::now_abi_cxx11_();
  pvVar1 = std::
           queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>_>
           ::front(&this->markets_);
  std::__cxx11::string::string((string *)&local_60,(string *)&pvVar1->second);
  std::__cxx11::string::string((string *)&local_90,(string *)&diff);
  dVar2 = Timing::time_diff_mins(&local_60,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_60);
  local_40 = dVar2;
  if ((dVar2 < (double)(int)time_now.field_2._12_4_) ||
     ((double)(int)time_now.field_2._8_4_ < dVar2)) {
    if (dVar2 < (double)(int)time_now.field_2._12_4_) {
      std::
      queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>_>
      ::pop(&this->markets_);
    }
    local_a4 = 10;
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_a0,&local_a4);
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&local_a0);
    local_94 = 0;
  }
  else {
    local_94 = 1;
  }
  std::__cxx11::string::~string((string *)&diff);
  return;
}

Assistant:

void MarketGenerator::poll_within(int time1, int time2) {

	wait_for_gen();
	std::string time_now = Timing::now();
	double diff = Timing::time_diff_mins(markets_.front().second.market_start_time_, time_now);
	if (diff >= time1 && diff <= time2)
		return;
	if (diff < time1) {
		markets_.pop();
	}
	std::this_thread::sleep_for(std::chrono::duration(std::chrono::seconds(10)));
}